

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O1

vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *
cfd::core::ScriptUtil::ExtractPubkeysFromMultisigScript
          (vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *__return_storage_ptr__,
          Script *multisig_script,uint32_t *require_num)

{
  undefined4 uVar1;
  uint32_t *puVar2;
  ScriptType SVar3;
  pointer __dest;
  CfdException *pCVar4;
  long lVar5;
  ulong uVar6;
  size_t __n;
  int64_t contain_pubkey_num;
  ScriptElement require_num_element;
  IteratorWrapper<cfd::core::ScriptElement> itr;
  ScriptElement element;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> elements;
  ScriptElementType local_23c;
  ByteData local_238;
  long local_220;
  CfdSourceLocation local_218;
  ScriptElement local_200;
  ScriptElement local_1a0;
  uint32_t *local_140;
  IteratorWrapper<cfd::core::ScriptElement> local_138;
  ScriptElement local_e0;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_80;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_68;
  string local_50;
  
  (__return_storage_ptr__->super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::vector
            (&local_68,&multisig_script->script_stack_);
  ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::vector
            (&local_80,&local_68);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Invalid script element access","");
  IteratorWrapper<cfd::core::ScriptElement>::IteratorWrapper(&local_138,&local_80,&local_50,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
            (&local_80);
  do {
    while( true ) {
      if ((&local_138.iterator_)[local_138.reverse_]._M_current ==
          *(ScriptElement **)
           ((long)&local_138.vector_.
                   super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                   ._M_impl.super__Vector_impl_data._M_start + (ulong)(local_138.reverse_ ^ 1) * 8))
      goto LAB_00417b10;
      IteratorWrapper<cfd::core::ScriptElement>::next(&local_e0,&local_138);
      SVar3 = local_e0.op_code_.data_type_;
      uVar1 = ScriptOperator::OP_CHECKMULTISIGVERIFY._8_4_;
      if (local_e0.type_ == kElementOpCode) break;
      ScriptElement::~ScriptElement(&local_e0);
    }
    if (local_e0.op_code_.data_type_ == ScriptOperator::OP_CHECKMULTISIG._8_4_) {
      ScriptElement::~ScriptElement(&local_e0);
      break;
    }
    ScriptElement::~ScriptElement(&local_e0);
  } while (SVar3 != uVar1);
LAB_00417b10:
  if ((&local_138.iterator_)[local_138.reverse_]._M_current ==
      *(ScriptElement **)
       ((long)&local_138.vector_.
               super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
               ._M_impl.super__Vector_impl_data._M_start + (ulong)(local_138.reverse_ ^ 1) * 8)) {
    local_200._vptr_ScriptElement = (_func_int **)0x597eac;
    local_200.type_ = 0x628;
    local_200.op_code_._vptr_ScriptOperator = (_func_int **)0x541e5a;
    Script::ToString_abi_cxx11_((string *)&local_e0,multisig_script);
    logger::log<std::__cxx11::string&>
              ((CfdSourceLocation *)&local_200,kCfdLogLevelWarning,
               "Multisig opcode (OP_CHECKMULTISIG|VERIFY) not found in redeem script: script={}",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0);
    if ((ScriptOperator *)local_e0._vptr_ScriptElement != &local_e0.op_code_) {
      operator_delete(local_e0._vptr_ScriptElement);
    }
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_e0._vptr_ScriptElement = (_func_int **)&local_e0.op_code_;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,
               "OP_CHCKMULTISIG(OP_CHECKMULTISIGVERIFY) not found in redeem script.","");
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_e0);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_140 = require_num;
  IteratorWrapper<cfd::core::ScriptElement>::next(&local_e0,&local_138);
  if (((local_e0.type_ != kElementNumber) && (local_e0.value_ == 0)) &&
     (local_e0.op_code_.data_type_ != kOpFalse)) {
    local_1a0._vptr_ScriptElement = (_func_int **)0x597eac;
    local_1a0.type_ = 0x636;
    local_1a0.op_code_._vptr_ScriptOperator = (_func_int **)0x541e5a;
    Script::ToString_abi_cxx11_((string *)&local_200,multisig_script);
    logger::log<std::__cxx11::string&>
              ((CfdSourceLocation *)&local_1a0,kCfdLogLevelWarning,
               "Invalid OP_CHECKMULTISIG(VERIFY) input in redeem script. Missing contain pubkey number.: script={}"
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_200);
    if ((ScriptOperator *)local_200._vptr_ScriptElement != &local_200.op_code_) {
      operator_delete(local_200._vptr_ScriptElement);
    }
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_200._vptr_ScriptElement = (_func_int **)&local_200.op_code_;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_200,
               "Invalid OP_CHCKMULTISIG(OP_CHECKMULTISIGVERIFY) input in redeem script. Missing contain pubkey number."
               ,"");
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_200);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_220 = local_e0.value_;
  if (0 < local_e0.value_) {
    lVar5 = 0;
    do {
      if ((&local_138.iterator_)[local_138.reverse_]._M_current ==
          *(ScriptElement **)
           ((long)&local_138.vector_.
                   super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                   ._M_impl.super__Vector_impl_data._M_start + (ulong)(local_138.reverse_ ^ 1) * 8))
      {
        local_1a0._vptr_ScriptElement = (_func_int **)0x597eac;
        local_1a0.type_ = 0x645;
        local_1a0.op_code_._vptr_ScriptOperator = (_func_int **)0x541e5a;
        Script::ToString_abi_cxx11_((string *)&local_200,multisig_script);
        logger::log<long&,std::__cxx11::string&>
                  ((CfdSourceLocation *)&local_1a0,kCfdLogLevelWarning,
                   "Not found enough pubkeys in redeem script.: require_pubkey_num={}, script={}",
                   &local_220,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_200);
        if ((ScriptOperator *)local_200._vptr_ScriptElement != &local_200.op_code_) {
          operator_delete(local_200._vptr_ScriptElement);
        }
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        local_200._vptr_ScriptElement = (_func_int **)&local_200.op_code_;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_200,"Not found enough pubkeys in redeem script.","");
        CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_200);
        __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
      }
      IteratorWrapper<cfd::core::ScriptElement>::next(&local_200,&local_138);
      if (local_200.type_ != kElementBinary) {
        local_218.filename = "cfdcore_script.cpp";
        local_218.line = 0x652;
        local_218.funcname = "ExtractPubkeysFromMultisigScript";
        local_23c = local_200.type_;
        ScriptElement::ToString_abi_cxx11_((string *)&local_1a0,&local_200);
        logger::log<cfd::core::ScriptElementType&,std::__cxx11::string&>
                  (&local_218,kCfdLogLevelWarning,
                   "Invalid script element. Not binary element.: ScriptElementType={}, data={}",
                   &local_23c,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a0);
        if ((ScriptOperator *)local_1a0._vptr_ScriptElement != &local_1a0.op_code_) {
          operator_delete(local_1a0._vptr_ScriptElement);
        }
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        local_1a0._vptr_ScriptElement = (_func_int **)&local_1a0.op_code_;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1a0,"Invalid ScriptElementType.(not binary)","");
        CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_1a0);
        __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
      }
      local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar6 = (long)local_200.binary_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_200.binary_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      if (uVar6 == 0) {
        __dest = (pointer)0x0;
      }
      else {
        if ((long)uVar6 < 0) {
          ::std::__throw_bad_alloc();
        }
        __dest = (pointer)operator_new(uVar6);
      }
      local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = __dest + uVar6;
      __n = (long)local_200.binary_data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_200.binary_data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = __dest;
      if (__n != 0) {
        local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = __dest;
        memmove(__dest,local_200.binary_data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,__n);
      }
      local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = __dest + __n;
      Pubkey::Pubkey((Pubkey *)&local_1a0,&local_238);
      ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::
      emplace_back<cfd::core::Pubkey>(__return_storage_ptr__,(Pubkey *)&local_1a0);
      if (local_1a0._vptr_ScriptElement != (_func_int **)0x0) {
        operator_delete(local_1a0._vptr_ScriptElement);
      }
      if (local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_238.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      ScriptElement::~ScriptElement(&local_200);
      lVar5 = lVar5 + 1;
    } while (lVar5 < local_220);
  }
  local_1a0._vptr_ScriptElement = (_func_int **)CONCAT44(local_1a0._vptr_ScriptElement._4_4_,0xff);
  ScriptElement::ScriptElement(&local_200,(ScriptType *)&local_1a0);
  puVar2 = local_140;
  if ((&local_138.iterator_)[local_138.reverse_]._M_current !=
      *(ScriptElement **)
       ((long)&local_138.vector_.
               super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
               ._M_impl.super__Vector_impl_data._M_start + (ulong)(local_138.reverse_ ^ 1) * 8)) {
    IteratorWrapper<cfd::core::ScriptElement>::next(&local_1a0,&local_138);
    ScriptElement::operator=(&local_200,&local_1a0);
    ScriptElement::~ScriptElement(&local_1a0);
  }
  if (((local_200.type_ == kElementNumber || local_200.value_ != 0) &&
      (local_200.type_ == kElementOpCode)) && (0 < local_200.value_)) {
    if (puVar2 != (uint32_t *)0x0) {
      *puVar2 = (uint32_t)local_200.value_;
    }
    ::std::
    __reverse<__gnu_cxx::__normal_iterator<cfd::core::Pubkey*,std::vector<cfd::core::Pubkey,std::allocator<cfd::core::Pubkey>>>>
              ((__return_storage_ptr__->
               super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (__return_storage_ptr__->
               super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    ScriptElement::~ScriptElement(&local_200);
    ScriptElement::~ScriptElement(&local_e0);
    IteratorWrapper<cfd::core::ScriptElement>::~IteratorWrapper(&local_138);
    ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              (&local_68);
    return __return_storage_ptr__;
  }
  local_218.filename = "cfdcore_script.cpp";
  local_218.line = 0x667;
  local_218.funcname = "ExtractPubkeysFromMultisigScript";
  Script::ToString_abi_cxx11_((string *)&local_1a0,multisig_script);
  logger::log<std::__cxx11::string&>
            (&local_218,kCfdLogLevelWarning,
             "Invalid OP_CHECKMULTISIG(VERIFY) input in redeem script. Missing require signature number.: script={}"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a0);
  if ((ScriptOperator *)local_1a0._vptr_ScriptElement != &local_1a0.op_code_) {
    operator_delete(local_1a0._vptr_ScriptElement);
  }
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  local_1a0._vptr_ScriptElement = (_func_int **)&local_1a0.op_code_;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a0,
             "Invalid OP_CHCKMULTISIG(OP_CHECKMULTISIGVERIFY) input in redeem script. Missing require signature number."
             ,"");
  CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_1a0);
  __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::vector<Pubkey> ScriptUtil::ExtractPubkeysFromMultisigScript(
    const Script& multisig_script, uint32_t* require_num) {
  std::vector<Pubkey> pubkeys;
  const std::vector<ScriptElement> elements = multisig_script.GetElementList();

  // find OP_CHECKMULTISIG or OP_CHECKMULTISIGVERIFY
  IteratorWrapper<ScriptElement> itr = IteratorWrapper<ScriptElement>(
      elements, "Invalid script element access", true);
  // search OP_CHECKMULTISIG(or VERIFY)
  while (itr.hasNext()) {
    ScriptElement element = itr.next();
    if (!element.IsOpCode()) {
      continue;
    }
    if (element.GetOpCode() == ScriptOperator::OP_CHECKMULTISIG ||
        element.GetOpCode() == ScriptOperator::OP_CHECKMULTISIGVERIFY) {
      break;
    }
  }
  // target opcode not found
  if (!itr.hasNext()) {
    warn(
        CFD_LOG_SOURCE,
        "Multisig opcode (OP_CHECKMULTISIG|VERIFY) not found"
        " in redeem script: script={}",
        multisig_script.ToString());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "OP_CHCKMULTISIG(OP_CHECKMULTISIGVERIFY) not found"
        " in redeem script.");
  }

  // get contain pubkey num
  const ScriptElement& op_m = itr.next();
  if (!op_m.IsNumber()) {
    warn(
        CFD_LOG_SOURCE,
        "Invalid OP_CHECKMULTISIG(VERIFY) input in redeem script."
        " Missing contain pubkey number.: script={}",
        multisig_script.ToString());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid OP_CHCKMULTISIG(OP_CHECKMULTISIGVERIFY) input"
        " in redeem script. Missing contain pubkey number.");
  }

  // set pubkey to vector(reverse data)
  int64_t contain_pubkey_num = op_m.GetNumber();
  for (int64_t i = 0; i < contain_pubkey_num; ++i) {
    if (!itr.hasNext()) {
      warn(
          CFD_LOG_SOURCE,
          "Not found enough pubkeys in redeem script.: "
          "require_pubkey_num={}, script={}",
          contain_pubkey_num, multisig_script.ToString());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Not found enough pubkeys in redeem script.");
    }

    const ScriptElement& pubkey_element = itr.next();
    // check script element type
    if (!pubkey_element.IsBinary()) {
      warn(
          CFD_LOG_SOURCE,
          "Invalid script element. Not binary element.: "
          "ScriptElementType={}, data={}",
          pubkey_element.GetType(), pubkey_element.ToString());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid ScriptElementType.(not binary)");
    }

    // push pubkey data
    pubkeys.push_back(Pubkey(pubkey_element.GetBinaryData()));
  }

  // check opcode(require signature num)
  ScriptElement require_num_element(ScriptType::kOpInvalidOpCode);
  if (itr.hasNext()) {
    require_num_element = itr.next();
  }
  if (!(require_num_element.IsNumber() && require_num_element.IsOpCode()) ||
      (require_num_element.GetNumber() <= 0)) {
    warn(
        CFD_LOG_SOURCE,
        "Invalid OP_CHECKMULTISIG(VERIFY) input in redeem script."
        " Missing require signature number.: script={}",
        multisig_script.ToString());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid OP_CHCKMULTISIG(OP_CHECKMULTISIGVERIFY) input"
        " in redeem script. Missing require signature number.");
  }

  if (require_num) {
    *require_num = static_cast<uint32_t>(require_num_element.GetNumber());
  }
  // return reverse pubkey vector
  std::reverse(std::begin(pubkeys), std::end(pubkeys));
  return pubkeys;
}